

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack16.h
# Opt level: O0

void ncnn::convdw3x3s2_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  long lVar69;
  long lVar70;
  int iVar71;
  undefined8 *puVar72;
  undefined1 (*pauVar73) [64];
  undefined1 (*pauVar74) [64];
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  __m512 _r22_2;
  __m512 _r21_2;
  __m512 _r20_2;
  __m512 _r12_2;
  __m512 _r11_2;
  __m512 _r10_2;
  __m512 _r02_2;
  __m512 _r01_2;
  __m512 _r00_2;
  __m512 _sum0_2;
  __m512 _r24_1;
  __m512 _r23_1;
  __m512 _r22_1;
  __m512 _r21_1;
  __m512 _r20_1;
  __m512 _r14_1;
  __m512 _r13_1;
  __m512 _r12_1;
  __m512 _r11_1;
  __m512 _r10_1;
  __m512 _r04_1;
  __m512 _r03_1;
  __m512 _r02_1;
  __m512 _r01_1;
  __m512 _r00_1;
  __m512 _sum1_1;
  __m512 _sum0_1;
  __m512 _r28;
  __m512 _r27;
  __m512 _r26;
  __m512 _r25;
  __m512 _r24;
  __m512 _r23;
  __m512 _r22;
  __m512 _r21;
  __m512 _r20;
  __m512 _r18;
  __m512 _r17;
  __m512 _r16;
  __m512 _r15;
  __m512 _r14;
  __m512 _r13;
  __m512 _r12;
  __m512 _r11;
  __m512 _r10;
  __m512 _r08;
  __m512 _r07;
  __m512 _r06;
  __m512 _r05;
  __m512 _r04;
  __m512 _r03;
  __m512 _r02;
  __m512 _r01;
  __m512 _r00;
  __m512 _sum3;
  __m512 _sum2;
  __m512 _sum1;
  __m512 _sum0;
  int j;
  int i;
  __m512 _k22;
  __m512 _k21;
  __m512 _k20;
  __m512 _k12;
  __m512 _k11;
  __m512 _k10;
  __m512 _k02;
  __m512 _k01;
  __m512 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m512 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 uStack_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 uStack_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 uStack_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 uStack_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 uStack_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 uStack_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 uStack_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 uStack_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  int local_3ac8;
  int local_3ac4;
  undefined1 (*local_3880) [64];
  undefined1 (*local_3878) [64];
  undefined1 (*local_3870) [64];
  undefined8 *local_3820;
  int local_376c;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar69 = in_RSI[6];
  lVar70 = in_RDI[7];
  iVar71 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 0x10;
  lVar2 = *in_RCX;
  for (local_376c = 0; local_376c < (int)lVar70; local_376c = local_376c + 1) {
    local_3820 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_376c * in_RSI[2]);
    if (lVar2 == 0) {
      local_4a40 = 0;
      uStack_4a38 = 0;
      uStack_4a30 = 0;
      uStack_4a28 = 0;
      uStack_4a20 = 0;
      uStack_4a18 = 0;
      uStack_4a10 = 0;
      uStack_4a08 = 0;
    }
    else {
      puVar72 = (undefined8 *)(lVar2 + (long)(local_376c << 4) * 4);
      local_4a40 = *puVar72;
      uStack_4a38 = puVar72[1];
      uStack_4a30 = puVar72[2];
      uStack_4a28 = puVar72[3];
      uStack_4a20 = puVar72[4];
      uStack_4a18 = puVar72[5];
      uStack_4a10 = puVar72[6];
      uStack_4a08 = puVar72[7];
    }
    pauVar73 = (undefined1 (*) [64])
               (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_376c * in_RDX[2]);
    local_3870 = (undefined1 (*) [64])(*in_RDI + in_RDI[8] * (long)local_376c * in_RDI[2]);
    local_3878 = (undefined1 (*) [64])
                 (*local_3870 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_3880 = (undefined1 (*) [64])
                 (*local_3870 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    auVar60 = *pauVar73;
    auVar43 = *pauVar73;
    auVar42 = *pauVar73;
    auVar9 = *pauVar73;
    auVar8 = *pauVar73;
    auVar7 = *pauVar73;
    auVar6 = *pauVar73;
    pauVar74 = pauVar73 + 1;
    auVar61 = *pauVar74;
    auVar45 = *pauVar74;
    auVar44 = *pauVar74;
    auVar13 = *pauVar74;
    auVar12 = *pauVar74;
    auVar11 = *pauVar74;
    auVar10 = *pauVar74;
    pauVar74 = pauVar73 + 2;
    auVar62 = *pauVar74;
    auVar47 = *pauVar74;
    auVar46 = *pauVar74;
    auVar17 = *pauVar74;
    auVar16 = *pauVar74;
    auVar15 = *pauVar74;
    auVar14 = *pauVar74;
    pauVar74 = pauVar73 + 3;
    auVar63 = *pauVar74;
    auVar49 = *pauVar74;
    auVar48 = *pauVar74;
    auVar21 = *pauVar74;
    auVar20 = *pauVar74;
    auVar19 = *pauVar74;
    auVar18 = *pauVar74;
    pauVar74 = pauVar73 + 4;
    auVar64 = *pauVar74;
    auVar51 = *pauVar74;
    auVar50 = *pauVar74;
    auVar25 = *pauVar74;
    auVar24 = *pauVar74;
    auVar23 = *pauVar74;
    auVar22 = *pauVar74;
    pauVar74 = pauVar73 + 5;
    auVar65 = *pauVar74;
    auVar53 = *pauVar74;
    auVar52 = *pauVar74;
    auVar29 = *pauVar74;
    auVar28 = *pauVar74;
    auVar27 = *pauVar74;
    auVar26 = *pauVar74;
    pauVar74 = pauVar73 + 6;
    auVar66 = *pauVar74;
    auVar55 = *pauVar74;
    auVar54 = *pauVar74;
    auVar33 = *pauVar74;
    auVar32 = *pauVar74;
    auVar31 = *pauVar74;
    auVar30 = *pauVar74;
    pauVar74 = pauVar73 + 7;
    auVar67 = *pauVar74;
    auVar57 = *pauVar74;
    auVar56 = *pauVar74;
    auVar37 = *pauVar74;
    auVar36 = *pauVar74;
    auVar35 = *pauVar74;
    auVar34 = *pauVar74;
    pauVar73 = pauVar73 + 8;
    auVar68 = *pauVar73;
    auVar59 = *pauVar73;
    auVar58 = *pauVar73;
    auVar41 = *pauVar73;
    auVar40 = *pauVar73;
    auVar39 = *pauVar73;
    auVar38 = *pauVar73;
    for (local_3ac4 = 0; local_3ac4 < (int)lVar69; local_3ac4 = local_3ac4 + 1) {
      for (local_3ac8 = 0; local_3ac8 + 3 < iVar1; local_3ac8 = local_3ac8 + 4) {
        auVar75._8_8_ = uStack_4a38;
        auVar75._0_8_ = local_4a40;
        auVar75._16_8_ = uStack_4a30;
        auVar75._24_8_ = uStack_4a28;
        auVar75._32_8_ = uStack_4a20;
        auVar75._40_8_ = uStack_4a18;
        auVar75._48_8_ = uStack_4a10;
        auVar75._56_8_ = uStack_4a08;
        auVar75 = vfmadd213ps_avx512f(*local_3870,auVar6,auVar75);
        auVar76._8_8_ = uStack_4a38;
        auVar76._0_8_ = local_4a40;
        auVar76._16_8_ = uStack_4a30;
        auVar76._24_8_ = uStack_4a28;
        auVar76._32_8_ = uStack_4a20;
        auVar76._40_8_ = uStack_4a18;
        auVar76._48_8_ = uStack_4a10;
        auVar76._56_8_ = uStack_4a08;
        auVar76 = vfmadd213ps_avx512f(local_3870[2],auVar7,auVar76);
        auVar77._8_8_ = uStack_4a38;
        auVar77._0_8_ = local_4a40;
        auVar77._16_8_ = uStack_4a30;
        auVar77._24_8_ = uStack_4a28;
        auVar77._32_8_ = uStack_4a20;
        auVar77._40_8_ = uStack_4a18;
        auVar77._48_8_ = uStack_4a10;
        auVar77._56_8_ = uStack_4a08;
        auVar77 = vfmadd213ps_avx512f(local_3870[4],auVar8,auVar77);
        auVar78._8_8_ = uStack_4a38;
        auVar78._0_8_ = local_4a40;
        auVar78._16_8_ = uStack_4a30;
        auVar78._24_8_ = uStack_4a28;
        auVar78._32_8_ = uStack_4a20;
        auVar78._40_8_ = uStack_4a18;
        auVar78._48_8_ = uStack_4a10;
        auVar78._56_8_ = uStack_4a08;
        auVar78 = vfmadd213ps_avx512f(local_3870[6],auVar9,auVar78);
        auVar75 = vfmadd213ps_avx512f(local_3870[1],auVar10,auVar75);
        auVar76 = vfmadd213ps_avx512f(local_3870[3],auVar11,auVar76);
        auVar77 = vfmadd213ps_avx512f(local_3870[5],auVar12,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3870[7],auVar13,auVar78);
        auVar75 = vfmadd213ps_avx512f(local_3870[2],auVar14,auVar75);
        auVar76 = vfmadd213ps_avx512f(local_3870[4],auVar15,auVar76);
        auVar77 = vfmadd213ps_avx512f(local_3870[6],auVar16,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3870[8],auVar17,auVar78);
        auVar75 = vfmadd213ps_avx512f(*local_3878,auVar18,auVar75);
        auVar76 = vfmadd213ps_avx512f(local_3878[2],auVar19,auVar76);
        auVar77 = vfmadd213ps_avx512f(local_3878[4],auVar20,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3878[6],auVar21,auVar78);
        auVar75 = vfmadd213ps_avx512f(local_3878[1],auVar22,auVar75);
        auVar76 = vfmadd213ps_avx512f(local_3878[3],auVar23,auVar76);
        auVar77 = vfmadd213ps_avx512f(local_3878[5],auVar24,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3878[7],auVar25,auVar78);
        auVar75 = vfmadd213ps_avx512f(local_3878[2],auVar26,auVar75);
        auVar76 = vfmadd213ps_avx512f(local_3878[4],auVar27,auVar76);
        auVar77 = vfmadd213ps_avx512f(local_3878[6],auVar28,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3878[8],auVar29,auVar78);
        auVar75 = vfmadd213ps_avx512f(*local_3880,auVar30,auVar75);
        auVar76 = vfmadd213ps_avx512f(local_3880[2],auVar31,auVar76);
        auVar77 = vfmadd213ps_avx512f(local_3880[4],auVar32,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3880[6],auVar33,auVar78);
        auVar75 = vfmadd213ps_avx512f(local_3880[1],auVar34,auVar75);
        auVar76 = vfmadd213ps_avx512f(local_3880[3],auVar35,auVar76);
        auVar77 = vfmadd213ps_avx512f(local_3880[5],auVar36,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3880[7],auVar37,auVar78);
        auVar75 = vfmadd213ps_avx512f(local_3880[2],auVar38,auVar75);
        local_52c0 = auVar75._0_8_;
        uStack_52b8 = auVar75._8_8_;
        uStack_52b0 = auVar75._16_8_;
        uStack_52a8 = auVar75._24_8_;
        uStack_52a0 = auVar75._32_8_;
        uStack_5298 = auVar75._40_8_;
        uStack_5290 = auVar75._48_8_;
        uStack_5288 = auVar75._56_8_;
        auVar76 = vfmadd213ps_avx512f(local_3880[4],auVar39,auVar76);
        local_5300 = auVar76._0_8_;
        uStack_52f8 = auVar76._8_8_;
        uStack_52f0 = auVar76._16_8_;
        uStack_52e8 = auVar76._24_8_;
        uStack_52e0 = auVar76._32_8_;
        uStack_52d8 = auVar76._40_8_;
        uStack_52d0 = auVar76._48_8_;
        uStack_52c8 = auVar76._56_8_;
        auVar77 = vfmadd213ps_avx512f(local_3880[6],auVar40,auVar77);
        local_5340 = auVar77._0_8_;
        uStack_5338 = auVar77._8_8_;
        uStack_5330 = auVar77._16_8_;
        uStack_5328 = auVar77._24_8_;
        uStack_5320 = auVar77._32_8_;
        uStack_5318 = auVar77._40_8_;
        uStack_5310 = auVar77._48_8_;
        uStack_5308 = auVar77._56_8_;
        auVar78 = vfmadd213ps_avx512f(local_3880[8],auVar41,auVar78);
        local_5380 = auVar78._0_8_;
        uStack_5378 = auVar78._8_8_;
        uStack_5370 = auVar78._16_8_;
        uStack_5368 = auVar78._24_8_;
        uStack_5360 = auVar78._32_8_;
        uStack_5358 = auVar78._40_8_;
        uStack_5350 = auVar78._48_8_;
        uStack_5348 = auVar78._56_8_;
        *local_3820 = local_52c0;
        local_3820[1] = uStack_52b8;
        local_3820[2] = uStack_52b0;
        local_3820[3] = uStack_52a8;
        local_3820[4] = uStack_52a0;
        local_3820[5] = uStack_5298;
        local_3820[6] = uStack_5290;
        local_3820[7] = uStack_5288;
        local_3820[8] = local_5300;
        local_3820[9] = uStack_52f8;
        local_3820[10] = uStack_52f0;
        local_3820[0xb] = uStack_52e8;
        local_3820[0xc] = uStack_52e0;
        local_3820[0xd] = uStack_52d8;
        local_3820[0xe] = uStack_52d0;
        local_3820[0xf] = uStack_52c8;
        local_3820[0x10] = local_5340;
        local_3820[0x11] = uStack_5338;
        local_3820[0x12] = uStack_5330;
        local_3820[0x13] = uStack_5328;
        local_3820[0x14] = uStack_5320;
        local_3820[0x15] = uStack_5318;
        local_3820[0x16] = uStack_5310;
        local_3820[0x17] = uStack_5308;
        local_3820[0x18] = local_5380;
        local_3820[0x19] = uStack_5378;
        local_3820[0x1a] = uStack_5370;
        local_3820[0x1b] = uStack_5368;
        local_3820[0x1c] = uStack_5360;
        local_3820[0x1d] = uStack_5358;
        local_3820[0x1e] = uStack_5350;
        local_3820[0x1f] = uStack_5348;
        local_3870 = local_3870 + 8;
        local_3878 = local_3878 + 8;
        local_3880 = local_3880 + 8;
        local_3820 = local_3820 + 0x20;
      }
      for (; local_3ac8 + 1 < iVar1; local_3ac8 = local_3ac8 + 2) {
        auVar5._8_8_ = uStack_4a38;
        auVar5._0_8_ = local_4a40;
        auVar5._16_8_ = uStack_4a30;
        auVar5._24_8_ = uStack_4a28;
        auVar5._32_8_ = uStack_4a20;
        auVar5._40_8_ = uStack_4a18;
        auVar5._48_8_ = uStack_4a10;
        auVar5._56_8_ = uStack_4a08;
        auVar78 = vfmadd213ps_avx512f(*local_3870,auVar42,auVar5);
        auVar4._8_8_ = uStack_4a38;
        auVar4._0_8_ = local_4a40;
        auVar4._16_8_ = uStack_4a30;
        auVar4._24_8_ = uStack_4a28;
        auVar4._32_8_ = uStack_4a20;
        auVar4._40_8_ = uStack_4a18;
        auVar4._48_8_ = uStack_4a10;
        auVar4._56_8_ = uStack_4a08;
        auVar77 = vfmadd213ps_avx512f(local_3870[2],auVar43,auVar4);
        auVar78 = vfmadd213ps_avx512f(local_3870[1],auVar44,auVar78);
        auVar77 = vfmadd213ps_avx512f(local_3870[3],auVar45,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3870[2],auVar46,auVar78);
        auVar77 = vfmadd213ps_avx512f(local_3870[4],auVar47,auVar77);
        auVar78 = vfmadd213ps_avx512f(*local_3878,auVar48,auVar78);
        auVar77 = vfmadd213ps_avx512f(local_3878[2],auVar49,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3878[1],auVar50,auVar78);
        auVar77 = vfmadd213ps_avx512f(local_3878[3],auVar51,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3878[2],auVar52,auVar78);
        auVar77 = vfmadd213ps_avx512f(local_3878[4],auVar53,auVar77);
        auVar78 = vfmadd213ps_avx512f(*local_3880,auVar54,auVar78);
        auVar77 = vfmadd213ps_avx512f(local_3880[2],auVar55,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3880[1],auVar56,auVar78);
        auVar77 = vfmadd213ps_avx512f(local_3880[3],auVar57,auVar77);
        auVar78 = vfmadd213ps_avx512f(local_3880[2],auVar58,auVar78);
        local_57c0 = auVar78._0_8_;
        uStack_57b8 = auVar78._8_8_;
        uStack_57b0 = auVar78._16_8_;
        uStack_57a8 = auVar78._24_8_;
        uStack_57a0 = auVar78._32_8_;
        uStack_5798 = auVar78._40_8_;
        uStack_5790 = auVar78._48_8_;
        uStack_5788 = auVar78._56_8_;
        auVar78 = vfmadd213ps_avx512f(local_3880[4],auVar59,auVar77);
        local_5800 = auVar78._0_8_;
        uStack_57f8 = auVar78._8_8_;
        uStack_57f0 = auVar78._16_8_;
        uStack_57e8 = auVar78._24_8_;
        uStack_57e0 = auVar78._32_8_;
        uStack_57d8 = auVar78._40_8_;
        uStack_57d0 = auVar78._48_8_;
        uStack_57c8 = auVar78._56_8_;
        *local_3820 = local_57c0;
        local_3820[1] = uStack_57b8;
        local_3820[2] = uStack_57b0;
        local_3820[3] = uStack_57a8;
        local_3820[4] = uStack_57a0;
        local_3820[5] = uStack_5798;
        local_3820[6] = uStack_5790;
        local_3820[7] = uStack_5788;
        local_3820[8] = local_5800;
        local_3820[9] = uStack_57f8;
        local_3820[10] = uStack_57f0;
        local_3820[0xb] = uStack_57e8;
        local_3820[0xc] = uStack_57e0;
        local_3820[0xd] = uStack_57d8;
        local_3820[0xe] = uStack_57d0;
        local_3820[0xf] = uStack_57c8;
        local_3870 = local_3870 + 4;
        local_3878 = local_3878 + 4;
        local_3880 = local_3880 + 4;
        local_3820 = local_3820 + 0x10;
      }
      for (; local_3ac8 < iVar1; local_3ac8 = local_3ac8 + 1) {
        auVar3._8_8_ = uStack_4a38;
        auVar3._0_8_ = local_4a40;
        auVar3._16_8_ = uStack_4a30;
        auVar3._24_8_ = uStack_4a28;
        auVar3._32_8_ = uStack_4a20;
        auVar3._40_8_ = uStack_4a18;
        auVar3._48_8_ = uStack_4a10;
        auVar3._56_8_ = uStack_4a08;
        auVar78 = vfmadd213ps_avx512f(*local_3870,auVar60,auVar3);
        auVar78 = vfmadd213ps_avx512f(local_3870[1],auVar61,auVar78);
        auVar78 = vfmadd213ps_avx512f(local_3870[2],auVar62,auVar78);
        auVar78 = vfmadd213ps_avx512f(*local_3878,auVar63,auVar78);
        auVar78 = vfmadd213ps_avx512f(local_3878[1],auVar64,auVar78);
        auVar78 = vfmadd213ps_avx512f(local_3878[2],auVar65,auVar78);
        auVar78 = vfmadd213ps_avx512f(*local_3880,auVar66,auVar78);
        auVar78 = vfmadd213ps_avx512f(local_3880[1],auVar67,auVar78);
        auVar78 = vfmadd213ps_avx512f(local_3880[2],auVar68,auVar78);
        local_5a40 = auVar78._0_8_;
        uStack_5a38 = auVar78._8_8_;
        uStack_5a30 = auVar78._16_8_;
        uStack_5a28 = auVar78._24_8_;
        uStack_5a20 = auVar78._32_8_;
        uStack_5a18 = auVar78._40_8_;
        uStack_5a10 = auVar78._48_8_;
        uStack_5a08 = auVar78._56_8_;
        *local_3820 = local_5a40;
        local_3820[1] = uStack_5a38;
        local_3820[2] = uStack_5a30;
        local_3820[3] = uStack_5a28;
        local_3820[4] = uStack_5a20;
        local_3820[5] = uStack_5a18;
        local_3820[6] = uStack_5a10;
        local_3820[7] = uStack_5a08;
        local_3870 = local_3870 + 2;
        local_3878 = local_3878 + 2;
        local_3880 = local_3880 + 2;
        local_3820 = local_3820 + 8;
      }
      local_3870 = (undefined1 (*) [64])(*local_3870 + (long)iVar71 * 4);
      local_3878 = (undefined1 (*) [64])(*local_3878 + (long)iVar71 * 4);
      local_3880 = (undefined1 (*) [64])(*local_3880 + (long)iVar71 * 4);
    }
  }
  return;
}

Assistant:

static void convdw3x3s2_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 16;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m512 _bias0 = bias ? _mm512_loadu_ps((const float*)bias + g * 16) : _mm512_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m512 _k00 = _mm512_load_ps(k0);
        __m512 _k01 = _mm512_load_ps(k0 + 16);
        __m512 _k02 = _mm512_load_ps(k0 + 32);
        __m512 _k10 = _mm512_load_ps(k0 + 48);
        __m512 _k11 = _mm512_load_ps(k0 + 64);
        __m512 _k12 = _mm512_load_ps(k0 + 80);
        __m512 _k20 = _mm512_load_ps(k0 + 96);
        __m512 _k21 = _mm512_load_ps(k0 + 112);
        __m512 _k22 = _mm512_load_ps(k0 + 128);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m512 _sum0 = _bias0;
                __m512 _sum1 = _bias0;
                __m512 _sum2 = _bias0;
                __m512 _sum3 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);
                __m512 _r05 = _mm512_load_ps(r0 + 80);
                __m512 _r06 = _mm512_load_ps(r0 + 96);
                __m512 _r07 = _mm512_load_ps(r0 + 112);
                __m512 _r08 = _mm512_load_ps(r0 + 128);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm512_fmadd_ps(_k00, _r02, _sum1);
                _sum2 = _mm512_fmadd_ps(_k00, _r04, _sum2);
                _sum3 = _mm512_fmadd_ps(_k00, _r06, _sum3);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm512_fmadd_ps(_k01, _r03, _sum1);
                _sum2 = _mm512_fmadd_ps(_k01, _r05, _sum2);
                _sum3 = _mm512_fmadd_ps(_k01, _r07, _sum3);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm512_fmadd_ps(_k02, _r04, _sum1);
                _sum2 = _mm512_fmadd_ps(_k02, _r06, _sum2);
                _sum3 = _mm512_fmadd_ps(_k02, _r08, _sum3);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);
                __m512 _r15 = _mm512_load_ps(r1 + 80);
                __m512 _r16 = _mm512_load_ps(r1 + 96);
                __m512 _r17 = _mm512_load_ps(r1 + 112);
                __m512 _r18 = _mm512_load_ps(r1 + 128);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm512_fmadd_ps(_k10, _r12, _sum1);
                _sum2 = _mm512_fmadd_ps(_k10, _r14, _sum2);
                _sum3 = _mm512_fmadd_ps(_k10, _r16, _sum3);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm512_fmadd_ps(_k11, _r13, _sum1);
                _sum2 = _mm512_fmadd_ps(_k11, _r15, _sum2);
                _sum3 = _mm512_fmadd_ps(_k11, _r17, _sum3);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm512_fmadd_ps(_k12, _r14, _sum1);
                _sum2 = _mm512_fmadd_ps(_k12, _r16, _sum2);
                _sum3 = _mm512_fmadd_ps(_k12, _r18, _sum3);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);
                __m512 _r25 = _mm512_load_ps(r2 + 80);
                __m512 _r26 = _mm512_load_ps(r2 + 96);
                __m512 _r27 = _mm512_load_ps(r2 + 112);
                __m512 _r28 = _mm512_load_ps(r2 + 128);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm512_fmadd_ps(_k20, _r22, _sum1);
                _sum2 = _mm512_fmadd_ps(_k20, _r24, _sum2);
                _sum3 = _mm512_fmadd_ps(_k20, _r26, _sum3);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm512_fmadd_ps(_k21, _r23, _sum1);
                _sum2 = _mm512_fmadd_ps(_k21, _r25, _sum2);
                _sum3 = _mm512_fmadd_ps(_k21, _r27, _sum3);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm512_fmadd_ps(_k22, _r24, _sum1);
                _sum2 = _mm512_fmadd_ps(_k22, _r26, _sum2);
                _sum3 = _mm512_fmadd_ps(_k22, _r28, _sum3);

                _mm512_store_ps(outptr0, _sum0);
                _mm512_store_ps(outptr0 + 16, _sum1);
                _mm512_store_ps(outptr0 + 32, _sum2);
                _mm512_store_ps(outptr0 + 48, _sum3);

                r0 += 2 * 64;
                r1 += 2 * 64;
                r2 += 2 * 64;
                outptr0 += 64;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m512 _sum0 = _bias0;
                __m512 _sum1 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm512_fmadd_ps(_k00, _r02, _sum1);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm512_fmadd_ps(_k01, _r03, _sum1);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm512_fmadd_ps(_k02, _r04, _sum1);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm512_fmadd_ps(_k10, _r12, _sum1);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm512_fmadd_ps(_k11, _r13, _sum1);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm512_fmadd_ps(_k12, _r14, _sum1);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm512_fmadd_ps(_k20, _r22, _sum1);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm512_fmadd_ps(_k21, _r23, _sum1);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm512_fmadd_ps(_k22, _r24, _sum1);

                _mm512_store_ps(outptr0, _sum0);
                _mm512_store_ps(outptr0 + 16, _sum1);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j < outw; j++)
            {
                __m512 _sum0 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);

                _mm512_store_ps(outptr0, _sum0);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}